

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O0

void ecs_records_clear(ecs_vector_t *records)

{
  int32_t iVar1;
  void *pvVar2;
  ecs_record_t **r;
  int32_t count;
  int32_t i;
  ecs_vector_t *records_local;
  
  iVar1 = ecs_vector_count(records);
  pvVar2 = _ecs_vector_first(records,8,0x10);
  for (r._4_4_ = 0; r._4_4_ < iVar1; r._4_4_ = r._4_4_ + 1) {
    **(undefined8 **)((long)pvVar2 + (long)r._4_4_ * 8) = 0;
    if (*(int *)(*(long *)((long)pvVar2 + (long)r._4_4_ * 8) + 8) < 0) {
      *(undefined4 *)(*(long *)((long)pvVar2 + (long)r._4_4_ * 8) + 8) = 0xffffffff;
    }
    else {
      *(undefined4 *)(*(long *)((long)pvVar2 + (long)r._4_4_ * 8) + 8) = 0;
    }
  }
  return;
}

Assistant:

void ecs_records_clear(
    ecs_vector_t *records)
{
    int32_t i, count = ecs_vector_count(records);
    ecs_record_t **r = ecs_vector_first(records, ecs_record_t*);

    for (i = 0; i < count; i ++) {
        r[i]->table = NULL;
        if (r[i]->row < 0) {
            r[i]->row = -1;
        } else {
            r[i]->row = 0;
        }
    }
}